

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>_>_>
* vkt::api::anon_unknown_1::DescriptorSet::createMultiple
            (vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>_>_>
             *__return_storage_ptr__,Environment *env,Resources *res,Parameters *param_3,
            vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
            *pOutHandles,VkResult *pOutResult)

{
  DeviceInterface *deviceIface;
  VkDevice device;
  Deleter<vk::Handle<(vk::HandleType)22>_> deleter;
  VkResult VVar1;
  size_type sVar2;
  Handle<(vk::HandleType)19> *__value;
  Handle<(vk::HandleType)21> *pHVar3;
  Move<vk::Handle<(vk::HandleType)22>> *this;
  Deleter<vk::Handle<(vk::HandleType)22>_> local_e0;
  deUint64 local_c8;
  Handle<(vk::HandleType)22> local_c0;
  SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_> local_b8;
  uint local_a8;
  undefined1 local_a1;
  deUint32 i;
  VkDescriptorSetAllocateInfo allocateInfo;
  allocator<vk::Handle<(vk::HandleType)19>_> local_61;
  undefined1 local_60 [8];
  vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
  descriptorSetLayouts;
  VkDescriptorSet *pHandles;
  deUint32 numDescriptorSets;
  VkResult *pOutResult_local;
  vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
  *pOutHandles_local;
  Parameters *param_2_local;
  Resources *res_local;
  Environment *env_local;
  vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>_>_>
  *descriptorSets;
  
  sVar2 = std::
          vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>::
          size(pOutHandles);
  descriptorSetLayouts.
  super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
                ::operator[](pOutHandles,0);
  __value = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::get
                      (&(res->descriptorSetLayout).object.
                        super_RefBase<vk::Handle<(vk::HandleType)19>_>);
  std::allocator<vk::Handle<(vk::HandleType)19>_>::allocator(&local_61);
  std::vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>::
  vector((vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_> *
         )local_60,sVar2 & 0xffffffff,__value,&local_61);
  std::allocator<vk::Handle<(vk::HandleType)19>_>::~allocator(&local_61);
  i = 0x22;
  allocateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  allocateInfo._4_4_ = 0;
  pHVar3 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                     (&(res->descriptorPool).object.super_RefBase<vk::Handle<(vk::HandleType)21>_>);
  allocateInfo.pNext = (void *)pHVar3->m_internal;
  allocateInfo.descriptorPool.m_internal._0_4_ = (uint)sVar2;
  allocateInfo._24_8_ =
       std::vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
       ::operator[]((vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                     *)local_60,0);
  VVar1 = (*env->vkd->_vptr_DeviceInterface[0x3c])
                    (env->vkd,env->device,&i,
                     descriptorSetLayouts.
                     super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  *pOutResult = VVar1;
  local_a1 = 0;
  std::
  vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>_>_>
  ::vector(__return_storage_ptr__);
  if (*pOutResult == VK_SUCCESS) {
    for (local_a8 = 0; local_a8 < (uint)sVar2; local_a8 = local_a8 + 1) {
      this = (Move<vk::Handle<(vk::HandleType)22>> *)operator_new(0x20);
      local_c8 = descriptorSetLayouts.
                 super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage[local_a8].m_internal;
      local_c0.m_internal =
           (deUint64)::vk::refdetails::check<vk::Handle<(vk::HandleType)22>>(local_c8);
      deviceIface = env->vkd;
      device = env->device;
      pHVar3 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                         (&(res->descriptorPool).object.
                           super_RefBase<vk::Handle<(vk::HandleType)21>_>);
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)22>_>::Deleter
                (&local_e0,deviceIface,device,(VkDescriptorPool)pHVar3->m_internal);
      deleter.m_device = local_e0.m_device;
      deleter.m_deviceIface = local_e0.m_deviceIface;
      deleter.m_pool.m_internal = local_e0.m_pool.m_internal;
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>>::Move<vk::Handle<(vk::HandleType)22>>
                (this,(Checked<vk::Handle<(vk::HandleType)22>_>)local_c0.m_internal,deleter);
      de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>::SharedPtr
                (&local_b8,(Move<vk::Handle<(vk::HandleType)22>_> *)this);
      std::
      vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>_>_>
      ::push_back(__return_storage_ptr__,&local_b8);
      de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>::~SharedPtr(&local_b8);
    }
  }
  local_a1 = 1;
  std::vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>::
  ~vector((vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
           *)local_60);
  return __return_storage_ptr__;
}

Assistant:

static vector<VkDescriptorSetSp> createMultiple (const Environment& env, const Resources& res, const Parameters&, vector<VkDescriptorSet>* const pOutHandles, VkResult* const pOutResult)
	{
		DE_ASSERT(pOutResult);
		DE_ASSERT(pOutHandles);
		DE_ASSERT(pOutHandles->size() != 0);

		const deUint32						numDescriptorSets		= static_cast<deUint32>(pOutHandles->size());
		VkDescriptorSet* const				pHandles				= &(*pOutHandles)[0];
		const vector<VkDescriptorSetLayout>	descriptorSetLayouts	(numDescriptorSets, res.descriptorSetLayout.object.get());

		const VkDescriptorSetAllocateInfo	allocateInfo			=
		{
			VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,
			DE_NULL,
			*res.descriptorPool.object,
			numDescriptorSets,
			&descriptorSetLayouts[0],
		};

		*pOutResult = env.vkd.allocateDescriptorSets(env.device, &allocateInfo, pHandles);

		vector<VkDescriptorSetSp>	descriptorSets;

		if (*pOutResult == VK_SUCCESS)
		{
			for (deUint32 i = 0; i < numDescriptorSets; ++i)
				descriptorSets.push_back(VkDescriptorSetSp(new Move<VkDescriptorSet>(check<VkDescriptorSet>(pHandles[i]), Deleter<VkDescriptorSet>(env.vkd, env.device, *res.descriptorPool.object))));
		}

		return descriptorSets;
	}